

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_set_cr1_from_fpscr(DisasContext_conflict10 *ctx)

{
  TCGTemp *ts;
  
  ts = tcg_temp_new_internal_ppc64((TCGContext_conflict10 *)ctx,TCG_TYPE_I32,false);
  tcg_gen_extrl_i64_i32_ppc64
            ((TCGContext_conflict10 *)ctx,(TCGv_i32)((long)ts - (long)ctx),cpu_fpscr);
  tcg_gen_shri_i32_ppc64
            ((TCGContext_conflict10 *)ctx,cpu_crf[1],(TCGv_i32)((long)ts - (long)ctx),0x1c);
  tcg_temp_free_internal_ppc64((TCGContext_conflict10 *)ctx,ts);
  return;
}

Assistant:

static void gen_set_cr1_from_fpscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, tmp, cpu_fpscr);
    tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], tmp, 28);
    tcg_temp_free_i32(tcg_ctx, tmp);
}